

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

ssize_t bid_get_line(archive_read_filter *filter,uchar **b,ssize_t *avail,ssize_t *ravail,
                    ssize_t *nl,size_t *nbytes_read)

{
  bool bVar1;
  bool bVar2;
  ssize_t sVar3;
  uchar *puVar4;
  ssize_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (*avail == 0) {
    *nl = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = get_line(*b,*avail,nl);
  }
  bVar1 = false;
  do {
    if (*nl != 0) {
      return sVar3;
    }
    if (bVar1) {
      return sVar3;
    }
    lVar7 = *avail;
    if (sVar3 != lVar7) {
      return sVar3;
    }
    if (0x1ffff < *nbytes_read) {
      return sVar3;
    }
    lVar8 = *ravail;
    uVar6 = (ulong)((int)lVar8 + 0x3ffU & 0xfffffc00);
    puVar4 = (uchar *)__archive_read_filter_ahead(filter,uVar6 << (uVar6 < lVar8 + 0xa0U),avail);
    *b = puVar4;
    bVar1 = false;
    if (puVar4 == (uchar *)0x0) {
      bVar1 = false;
      if (*ravail < *avail) {
        puVar4 = (uchar *)__archive_read_filter_ahead(filter,*avail,avail);
        *b = puVar4;
        bVar1 = true;
        goto LAB_003c3e49;
      }
      bVar2 = false;
    }
    else {
LAB_003c3e49:
      lVar8 = lVar8 - lVar7;
      *nbytes_read = *avail;
      *ravail = *avail;
      puVar4 = *b;
      *b = puVar4 + lVar8;
      lVar7 = *avail - lVar8;
      *avail = lVar7;
      sVar5 = get_line(puVar4 + lVar8 + sVar3,lVar7 - sVar3,nl);
      lVar7 = 0;
      if (-1 < sVar5) {
        lVar7 = sVar3;
      }
      sVar3 = lVar7 + sVar5;
      bVar2 = true;
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

static ssize_t
bid_get_line(struct archive_read_filter *filter,
    const unsigned char **b, ssize_t *avail, ssize_t *ravail,
    ssize_t *nl, size_t* nbytes_read)
{
	ssize_t len;
	int quit;
	
	quit = 0;
	if (*avail == 0) {
		*nl = 0;
		len = 0;
	} else
		len = get_line(*b, *avail, nl);

	/*
	 * Read bytes more while it does not reach the end of line.
	 */
	while (*nl == 0 && len == *avail && !quit &&
	    *nbytes_read < UUENCODE_BID_MAX_READ) {
		ssize_t diff = *ravail - *avail;
		size_t nbytes_req = (*ravail+1023) & ~1023U;
		ssize_t tested;

		/* Increase reading bytes if it is not enough to at least
		 * new two lines. */
		if (nbytes_req < (size_t)*ravail + 160)
			nbytes_req <<= 1;

		*b = __archive_read_filter_ahead(filter, nbytes_req, avail);
		if (*b == NULL) {
			if (*ravail >= *avail)
				return (0);
			/* Reading bytes reaches the end of a stream. */
			*b = __archive_read_filter_ahead(filter, *avail, avail);
			quit = 1;
		}
		*nbytes_read = *avail;
		*ravail = *avail;
		*b += diff;
		*avail -= diff;
		tested = len;/* Skip some bytes we already determinated. */
		len = get_line(*b + tested, *avail - tested, nl);
		if (len >= 0)
			len += tested;
	}
	return (len);
}